

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O0

REF_STATUS
ref_inflate_rate(REF_INT nlayers,REF_DBL first_thickness,REF_DBL total_thickness,REF_DBL *rate)

{
  bool bVar1;
  uint uVar2;
  double local_60;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT iters;
  REF_BOOL keep_going;
  REF_DBL dHdr;
  REF_DBL err;
  REF_DBL H;
  REF_DBL r;
  REF_DBL *rate_local;
  REF_DBL total_thickness_local;
  REF_DBL first_thickness_local;
  REF_INT nlayers_local;
  
  H = 1.1;
  ref_private_macro_code_rss_1 = 0;
  bVar1 = true;
  r = (REF_DBL)rate;
  rate_local = (REF_DBL *)total_thickness;
  total_thickness_local = first_thickness;
  first_thickness_local._0_4_ = nlayers;
  while( true ) {
    if (!bVar1) {
      *(REF_DBL *)r = H;
      return 0;
    }
    ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
    if (100 < ref_private_macro_code_rss_1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
             0x3fd,"ref_inflate_rate","iteration count exceeded");
      return 1;
    }
    uVar2 = ref_inflate_total_thickness(first_thickness_local._0_4_,total_thickness_local,H,&err);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
             0x3ff,"ref_inflate_rate",(ulong)uVar2,"total");
      return uVar2;
    }
    dHdr = err - (double)rate_local;
    uVar2 = ref_inflate_dthickness
                      (first_thickness_local._0_4_,total_thickness_local,H,(REF_DBL *)&iters);
    if (uVar2 != 0) break;
    H = H - dHdr / _iters;
    if (dHdr / (double)rate_local <= 0.0) {
      local_60 = -(dHdr / (double)rate_local);
    }
    else {
      local_60 = dHdr / (double)rate_local;
    }
    bVar1 = 1e-12 < local_60;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x402,
         "ref_inflate_rate",(ulong)uVar2,"total");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_rate(REF_INT nlayers, REF_DBL first_thickness,
                                    REF_DBL total_thickness, REF_DBL *rate) {
  REF_DBL r, H, err, dHdr;
  REF_BOOL keep_going;
  REF_INT iters;
  r = 1.1;

  iters = 0;
  keep_going = REF_TRUE;
  while (keep_going) {
    iters++;
    if (iters > 100) THROW("iteration count exceeded");

    RSS(ref_inflate_total_thickness(nlayers, first_thickness, r, &H), "total");
    err = H - total_thickness;

    RSS(ref_inflate_dthickness(nlayers, first_thickness, r, &dHdr), "total");

    /* printf(" r %e H %e err %e dHdr %e\n",r,H,err,dHdr); */

    r = r - err / dHdr;

    keep_going = (ABS(err / total_thickness) > 1.0e-12);
  }

  *rate = r;

  return REF_SUCCESS;
}